

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O2

void duckdb::ReservoirQuantileOperation::Destroy<duckdb::ReservoirQuantileState<signed_char>>
               (ReservoirQuantileState<signed_char> *state,AggregateInputData *aggr_input_data)

{
  BaseReservoirSampling *this;
  
  if (state->v != (char *)0x0) {
    free(state->v);
    state->v = (char *)0x0;
  }
  this = state->r_samp;
  if (this != (BaseReservoirSampling *)0x0) {
    BaseReservoirSampling::~BaseReservoirSampling(this);
    operator_delete(this);
    state->r_samp = (BaseReservoirSampling *)0x0;
  }
  return;
}

Assistant:

static void Destroy(STATE &state, AggregateInputData &aggr_input_data) {
		if (state.v) {
			free(state.v);
			state.v = nullptr;
		}
		if (state.r_samp) {
			delete state.r_samp;
			state.r_samp = nullptr;
		}
	}